

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline.cpp
# Opt level: O1

void __thiscall Pipeline::Pipeline(Pipeline *this,Tetromino *transformee)

{
  vector<Transformation_*,_std::allocator<Transformation_*>_> *pvVar1;
  vector<Collidable_*,_std::allocator<Collidable_*>_> *pvVar2;
  
  this->transformee = transformee;
  pvVar1 = (vector<Transformation_*,_std::allocator<Transformation_*>_> *)operator_new(0x18);
  (pvVar1->super__Vector_base<Transformation_*,_std::allocator<Transformation_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar1->super__Vector_base<Transformation_*,_std::allocator<Transformation_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar1->super__Vector_base<Transformation_*,_std::allocator<Transformation_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->pipeline = pvVar1;
  pvVar2 = (vector<Collidable_*,_std::allocator<Collidable_*>_> *)operator_new(0x18);
  (pvVar2->super__Vector_base<Collidable_*,_std::allocator<Collidable_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar2->super__Vector_base<Collidable_*,_std::allocator<Collidable_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar2->super__Vector_base<Collidable_*,_std::allocator<Collidable_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->collidables = pvVar2;
  return;
}

Assistant:

Pipeline::Pipeline(Tetromino* transformee) {
    this->transformee = transformee;
    this->pipeline = new vector<Transformation*>();
    this->collidables = new vector<Collidable*>();
}